

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<128u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<128u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  unsigned_fast_type i;
  long lVar7;
  byte bVar8;
  sbyte sVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  uintwide_t<128U,_unsigned_int,_void,_false> local_68;
  value_type_conflict local_58 [4];
  array<unsigned_int,_4UL> local_48;
  array<unsigned_int,_4UL> local_38;
  int local_28 [4];
  
  local_38.elems[0] = 0;
  local_38.elems[1] = 0;
  local_38.elems[2] = 0;
  local_38.elems[3] = 0;
  uVar13 = input_generator->_M_x;
  uVar14 = 0;
  bVar6 = 1;
  lVar7 = 0;
  do {
    bVar8 = bVar6 - 1 & 3;
    if (bVar8 == 0) {
      uVar15 = (uVar13 % 0xadc8) * 0xbc8f;
      uVar14 = (uVar13 / 0xadc8) * 0xd47;
      uVar13 = (uVar13 / 0xadc8) * -0xd47;
      if (uVar15 < uVar14) {
        uVar13 = uVar14 ^ 0x7fffffff;
      }
      uVar13 = uVar13 + uVar15;
      input_generator->_M_x = uVar13;
      uVar14 = uVar13;
    }
    sVar9 = bVar8 << 3;
    puVar1 = (uint *)((long)local_38.elems + lVar7);
    *puVar1 = *puVar1 | (uVar14 >> sVar9 & 0xff) << sVar9;
    lVar7 = lVar7 + (ulong)((bVar6 & 3) == 0) * 4;
    bVar6 = bVar6 + 1;
  } while (lVar7 != 0x10);
  uVar4 = *(undefined8 *)input_params;
  uVar5 = *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  local_68.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
  local_68.values.super_array<unsigned_int,_4UL>.elems[1] = SUB84(uVar4,4);
  local_68.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar5;
  local_68.values.super_array<unsigned_int,_4UL>.elems[3] = SUB84(uVar5,4);
  local_48.elems[0] = 0;
  local_48.elems[1] = 0;
  local_48.elems[2] = 0;
  local_48.elems[3] = 0;
  lVar7 = 0xc;
  do {
    if (lVar7 == -4) {
      uVar10 = *(undefined8 *)
                (input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
      uVar12 = *(undefined8 *)(input_params + 4);
      local_58[0] = (value_type_conflict)uVar10;
      local_58[1] = SUB84(uVar10,4);
      local_58[2] = (value_type_conflict)uVar12;
      local_58[3] = SUB84(uVar12,4);
      local_28[0] = -1;
      local_28[1] = 0xffffffff;
      local_28[2] = 0xffffffff;
      local_28[3] = 0xffffffff;
      lVar7 = 0xc;
      goto LAB_0014d982;
    }
    piVar2 = (int *)((long)local_68.values.super_array<unsigned_int,_4UL>.elems + lVar7);
    piVar3 = (int *)((long)local_48.elems + lVar7);
    lVar7 = lVar7 + -4;
  } while (*piVar2 == *piVar3);
  uVar10 = *(undefined8 *)(input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1)
  ;
  uVar12 = *(undefined8 *)(input_params + 4);
  goto LAB_0014d99f;
  while (piVar2 = (int *)((long)local_58 + lVar7), piVar3 = (int *)((long)local_28 + lVar7),
        lVar7 = lVar7 + -4, *piVar2 == *piVar3) {
LAB_0014d982:
    if (lVar7 == -4) goto LAB_0014da35;
  }
LAB_0014d99f:
  local_58[0] = (value_type_conflict)uVar4;
  local_58[1] = SUB84(uVar4,4);
  local_58[2] = (value_type_conflict)uVar5;
  local_58[3] = SUB84(uVar5,4);
  local_68.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar10;
  local_68.values.super_array<unsigned_int,_4UL>.elems[1] = SUB84(uVar10,4);
  local_68.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar12;
  local_68.values.super_array<unsigned_int,_4UL>.elems[3] = SUB84(uVar12,4);
  lVar7 = 0;
  bVar16 = false;
  do {
    uVar11 = ((ulong)local_68.values.super_array<unsigned_int,_4UL>.elems[lVar7] - (ulong)bVar16) -
             (ulong)local_58[lVar7];
    local_68.values.super_array<unsigned_int,_4UL>.elems[lVar7] = (value_type_conflict)uVar11;
    bVar16 = uVar11 >> 0x20 != 0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  local_48.elems[2] = local_68.values.super_array<unsigned_int,_4UL>.elems[2];
  local_48.elems[3] = local_68.values.super_array<unsigned_int,_4UL>.elems[3];
  local_48.elems[0] = local_68.values.super_array<unsigned_int,_4UL>.elems[0];
  local_48.elems[1] = local_68.values.super_array<unsigned_int,_4UL>.elems[1];
  lVar7 = 0;
  do {
    piVar2 = (int *)((long)local_48.elems + lVar7);
    *piVar2 = *piVar2 + 1;
    if (*piVar2 != 0) break;
    bVar16 = lVar7 != 0xc;
    lVar7 = lVar7 + 4;
  } while (bVar16);
  local_68.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  uintwide_t<128U,_unsigned_int,_void,_false>::eval_divide_knuth
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_38,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)&local_48,&local_68);
  local_38.elems[2] = local_68.values.super_array<unsigned_int,_4UL>.elems[2];
  local_38.elems[3] = local_68.values.super_array<unsigned_int,_4UL>.elems[3];
  local_38.elems[0] = local_68.values.super_array<unsigned_int,_4UL>.elems[0];
  local_38.elems[1] = local_68.values.super_array<unsigned_int,_4UL>.elems[1];
  local_68.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)input_params;
  local_68.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  uintwide_t<128U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_38,&local_68);
LAB_0014da35:
  return (result_type)local_38.elems[0]._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }